

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testNativeFormat.cpp
# Opt level: O3

void testNativeFormat(string *tempDir)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Testing if incompressible pixel data are written in Xdr, not native format",0x4a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"image 1:",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  anon_unknown.dwarf_26e02e::readCopyRead
            ((anon_unknown_dwarf_26e02e *)(tempDir->_M_dataplus)._M_p,
             (string *)tempDir->_M_string_length,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/test_native1.exr"
             ,0xd4a3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"image 2:",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  anon_unknown.dwarf_26e02e::readCopyRead
            ((anon_unknown_dwarf_26e02e *)(tempDir->_M_dataplus)._M_p,
             (string *)tempDir->_M_string_length,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/test_native2.exr"
             ,0x9307);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void
testNativeFormat (const std::string& tempDir)
{
    try
    {
        cout << "Testing if incompressible pixel data are written "
                "in Xdr, not native format"
             << endl;

        cout << "image 1:" << endl;
        readCopyRead (tempDir, ILM_IMF_TEST_IMAGEDIR "test_native1.exr", 54435);

        cout << "image 2:" << endl;
        readCopyRead (tempDir, ILM_IMF_TEST_IMAGEDIR "test_native2.exr", 37639);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}